

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

LineHeight
Rml::ComputeLineHeight
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  Unit UVar1;
  code *pcVar2;
  bool bVar3;
  NumericValue value;
  ulong uVar4;
  float fVar5;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  LineHeight LVar6;
  float local_20;
  float local_1c;
  undefined1 local_18 [16];
  
  UVar1 = property->unit;
  if ((UVar1 & LENGTH) == UNKNOWN) {
    if (UVar1 == PERCENT) {
      local_1c = 0.0;
      Variant::GetInto<float,_0>(&property->value,&local_1c);
      local_20 = local_1c * 0.01;
    }
    else if (UVar1 == NUMBER) {
      local_20 = 0.0;
      Variant::GetInto<float,_0>(&property->value,&local_20);
    }
    else {
      bVar3 = Assert("Invalid unit for line-height",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xb2);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      local_20 = 1.0;
    }
    fVar5 = font_size * local_20;
    uVar4 = 0;
  }
  else {
    local_18._8_4_ = in_XMM3_Dc;
    local_18._0_8_ = vp_dimensions;
    local_18._12_4_ = in_XMM3_Dd;
    value = Property::GetNumericValue(property);
    local_20 = ComputeLength(value,font_size,document_font_size,dp_ratio,(Vector2f)local_18._0_8_);
    uVar4 = 0x100000000;
    fVar5 = local_20;
  }
  LVar6._0_8_ = (uint)fVar5 | uVar4;
  LVar6.inherit_value = local_20;
  return LVar6;
}

Assistant:

Style::LineHeight ComputeLineHeight(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::LineHeight(value, Style::LineHeight::Length, value);
	}

	float scale_factor = 1.0f;

	switch (property->unit)
	{
	case Unit::NUMBER: scale_factor = property->value.Get<float>(); break;
	case Unit::PERCENT: scale_factor = property->value.Get<float>() * 0.01f; break;
	default: RMLUI_ERRORMSG("Invalid unit for line-height");
	}

	float value = font_size * scale_factor;
	return Style::LineHeight(value, Style::LineHeight::Number, scale_factor);
}